

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

string * __thiscall
flatbuffers::ts::TsGenerator::GenStructMemberValueTS
          (string *__return_storage_ptr__,TsGenerator *this,StructDef *struct_def,string *prefix,
          string *delimiter,bool nullCheck)

{
  size_type *psVar1;
  undefined8 *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  BaseType BVar4;
  FieldDef *pFVar5;
  pointer pcVar6;
  int iVar7;
  undefined8 *puVar8;
  long *plVar9;
  char *pcVar10;
  long *plVar11;
  char **ppcVar12;
  undefined8 uVar13;
  undefined7 in_register_00000089;
  pointer ppFVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> curr_member_accessor;
  string local_130;
  char **local_110;
  long local_108;
  char *local_100;
  long lStack_f8;
  string *local_f0;
  char **local_e8;
  long local_e0;
  char *local_d8;
  long lStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  string local_c0;
  pointer local_a0;
  string *local_98;
  undefined4 local_8c;
  TsGenerator *local_88;
  string *local_80;
  IdlNamer *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_8c = (undefined4)CONCAT71(in_register_00000089,nullCheck);
  local_c8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ppFVar14 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_f0 = __return_storage_ptr__;
  if (ppFVar14 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar3 = &local_130.field_2;
    local_78 = &this->namer_;
    local_98 = prefix;
    local_88 = this;
    local_80 = delimiter;
    do {
      pFVar5 = *ppFVar14;
      pcVar6 = (local_98->_M_dataplus)._M_p;
      local_130._M_dataplus._M_p = (pointer)paVar3;
      local_a0 = ppFVar14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar6,pcVar6 + local_98->_M_string_length);
      std::__cxx11::string::append((char *)&local_130);
      (*(local_78->super_Namer)._vptr_Namer[4])((string *)&local_110,local_78,pFVar5);
      uVar13 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar3) {
        uVar13 = local_130.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < (char *)(local_130._M_string_length + local_108)) {
        pcVar10 = (char *)0xf;
        if (local_110 != &local_100) {
          pcVar10 = local_100;
        }
        if (pcVar10 < (char *)(local_130._M_string_length + local_108)) goto LAB_00265f70;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_110,0,(char *)0x0,(ulong)local_130._M_dataplus._M_p);
      }
      else {
LAB_00265f70:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110);
      }
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      psVar1 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_c0.field_2._M_allocated_capacity = *psVar1;
        local_c0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar1;
        local_c0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_c0._M_string_length = puVar8[1];
      *puVar8 = psVar1;
      puVar8[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_110 != &local_100) {
        operator_delete(local_110,(ulong)(local_100 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar3) {
        operator_delete(local_130._M_dataplus._M_p,
                        (ulong)(local_130.field_2._M_allocated_capacity + 1));
      }
      iVar7 = std::__cxx11::string::compare((char *)local_98);
      if (iVar7 != 0) {
        pcVar6 = (local_98->_M_dataplus)._M_p;
        local_110 = &local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar6,pcVar6 + local_98->_M_string_length);
        std::__cxx11::string::append((char *)&local_110);
        (*(local_78->super_Namer)._vptr_Namer[4])(&local_e8,local_78,pFVar5);
        pcVar10 = (char *)0xf;
        if (local_110 != &local_100) {
          pcVar10 = local_100;
        }
        if (pcVar10 < (char *)(local_e0 + local_108)) {
          pcVar10 = (char *)0xf;
          if (local_e8 != &local_d8) {
            pcVar10 = local_d8;
          }
          if (pcVar10 < (char *)(local_e0 + local_108)) goto LAB_002660b1;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_110);
        }
        else {
LAB_002660b1:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_e8)
          ;
        }
        puVar2 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar2) {
          local_130.field_2._M_allocated_capacity = *puVar2;
          local_130.field_2._8_8_ = puVar8[3];
          local_130._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_130.field_2._M_allocated_capacity = *puVar2;
          local_130._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_130._M_string_length = puVar8[1];
        *puVar8 = puVar2;
        puVar8[1] = 0;
        *(undefined1 *)puVar2 = 0;
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar3) {
          operator_delete(local_130._M_dataplus._M_p,
                          (ulong)(local_130.field_2._M_allocated_capacity + 1));
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,(ulong)(local_d8 + 1));
        }
        if (local_110 != &local_100) {
          operator_delete(local_110,(ulong)(local_100 + 1));
        }
      }
      if (((pFVar5->value).type.base_type == BASE_TYPE_STRUCT) &&
         (((pFVar5->value).type.struct_def)->fixed == true)) {
        GenStructMemberValueTS
                  (&local_130,local_88,(pFVar5->value).type.struct_def,&local_c0,local_80,true);
        std::__cxx11::string::_M_append((char *)local_f0,(ulong)local_130._M_dataplus._M_p);
        ppFVar14 = local_a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar3) {
          operator_delete(local_130._M_dataplus._M_p,
                          (ulong)(local_130.field_2._M_allocated_capacity + 1));
          ppFVar14 = local_a0;
        }
      }
      else if ((char)local_8c == '\0') {
        std::__cxx11::string::_M_append((char *)local_f0,(ulong)local_c0._M_dataplus._M_p);
        ppFVar14 = local_a0;
      }
      else {
        local_130._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"0","");
        BVar4 = (pFVar5->value).type.base_type;
        if (BVar4 - BASE_TYPE_LONG < 2) {
          pcVar10 = "BigInt(0)";
LAB_00266294:
          std::__cxx11::string::_M_replace
                    ((ulong)&local_130,0,(char *)local_130._M_string_length,(ulong)pcVar10);
        }
        else {
          if (BVar4 == BASE_TYPE_BOOL) {
            pcVar10 = "false";
            goto LAB_00266294;
          }
          if (BVar4 == BASE_TYPE_ARRAY) {
            pcVar10 = "[]";
            goto LAB_00266294;
          }
        }
        std::operator+(&local_50,"(",&local_c0);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70 = &local_60;
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_60 = *plVar11;
          lStack_58 = plVar9[3];
        }
        else {
          local_60 = *plVar11;
          local_70 = (long *)*plVar9;
        }
        local_68 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_70,(ulong)local_130._M_dataplus._M_p);
        local_e8 = &local_d8;
        ppcVar12 = (char **)(plVar9 + 2);
        if ((char **)*plVar9 == ppcVar12) {
          local_d8 = *ppcVar12;
          lStack_d0 = plVar9[3];
        }
        else {
          local_d8 = *ppcVar12;
          local_e8 = (char **)*plVar9;
        }
        local_e0 = plVar9[1];
        *plVar9 = (long)ppcVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
        ppcVar12 = (char **)(plVar9 + 2);
        if ((char **)*plVar9 == ppcVar12) {
          local_100 = *ppcVar12;
          lStack_f8 = plVar9[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *ppcVar12;
          local_110 = (char **)*plVar9;
        }
        local_108 = plVar9[1];
        *plVar9 = (long)ppcVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_f0,(ulong)local_110);
        if (local_110 != &local_100) {
          operator_delete(local_110,(ulong)(local_100 + 1));
        }
        ppFVar14 = local_a0;
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,(ulong)(local_d8 + 1));
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar3) {
          operator_delete(local_130._M_dataplus._M_p,
                          (ulong)(local_130.field_2._M_allocated_capacity + 1));
        }
      }
      ppFVar14 = ppFVar14 + 1;
      if (ppFVar14 !=
          (struct_def->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::_M_append((char *)local_f0,(ulong)(local_80->_M_dataplus)._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    } while (ppFVar14 !=
             (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return local_f0;
}

Assistant:

std::string GenStructMemberValueTS(const StructDef &struct_def,
                                     const std::string &prefix,
                                     const std::string &delimiter,
                                     const bool nullCheck = true) {
    std::string ret;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;

      auto curr_member_accessor = prefix + "." + namer_.Method(field);
      if (prefix != "this") {
        curr_member_accessor = prefix + "?." + namer_.Method(field);
      }
      if (IsStruct(field.value.type)) {
        ret += GenStructMemberValueTS(*field.value.type.struct_def,
                                      curr_member_accessor, delimiter);
      } else {
        if (nullCheck) {
          std::string nullValue = "0";
          if (field.value.type.base_type == BASE_TYPE_BOOL) {
            nullValue = "false";
          } else if (field.value.type.base_type == BASE_TYPE_LONG ||
                     field.value.type.base_type == BASE_TYPE_ULONG) {
            nullValue = "BigInt(0)";
          } else if (field.value.type.base_type == BASE_TYPE_ARRAY) {
            nullValue = "[]";
          }
          ret += "(" + curr_member_accessor + " ?? " + nullValue + ")";
        } else {
          ret += curr_member_accessor;
        }
      }

      if (std::next(it) != struct_def.fields.vec.end()) { ret += delimiter; }
    }

    return ret;
  }